

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O3

void aom_h_predictor_32x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 (*pauVar3) [16];
  uint8_t *puVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar14 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar14 = *(undefined1 (*) [16])left;
  auVar13._0_14_ = auVar14._0_14_;
  auVar13[0xe] = auVar14[7];
  auVar13[0xf] = auVar14[7];
  auVar12._14_2_ = auVar13._14_2_;
  auVar12._0_13_ = auVar14._0_13_;
  auVar12[0xd] = auVar14[6];
  auVar11._13_3_ = auVar12._13_3_;
  auVar11._0_12_ = auVar14._0_12_;
  auVar11[0xc] = auVar14[6];
  auVar10._12_4_ = auVar11._12_4_;
  auVar10._0_11_ = auVar14._0_11_;
  auVar10[0xb] = auVar14[5];
  auVar9._11_5_ = auVar10._11_5_;
  auVar9._0_10_ = auVar14._0_10_;
  auVar9[10] = auVar14[5];
  auVar8._10_6_ = auVar9._10_6_;
  auVar8._0_9_ = auVar14._0_9_;
  auVar8[9] = auVar14[4];
  auVar7._9_7_ = auVar8._9_7_;
  auVar7._0_8_ = auVar14._0_8_;
  auVar7[8] = auVar14[4];
  auVar6._8_8_ = auVar7._8_8_;
  auVar6[7] = auVar14[3];
  auVar6[6] = auVar14[3];
  auVar6[5] = auVar14[2];
  auVar6[4] = auVar14[2];
  auVar6[3] = auVar14[1];
  auVar6[2] = auVar14[1];
  auVar6[0] = auVar14[0];
  auVar6[1] = auVar6[0];
  auVar14 = pshuflw(in_XMM1,auVar6,0);
  local_48._0_4_ = auVar14._0_4_;
  local_48._4_4_ = local_48._0_4_;
  local_48._8_4_ = local_48._0_4_;
  local_48._12_4_ = local_48._0_4_;
  auVar14 = pshuflw(local_48,auVar6,0x55);
  local_38._0_4_ = auVar14._0_4_;
  local_38._4_4_ = local_38._0_4_;
  local_38._8_4_ = local_38._0_4_;
  local_38._12_4_ = local_38._0_4_;
  auVar14 = pshuflw(local_38,auVar6,0xaa);
  local_28._0_4_ = auVar14._0_4_;
  local_28._4_4_ = local_28._0_4_;
  local_28._8_4_ = local_28._0_4_;
  local_28._12_4_ = local_28._0_4_;
  auVar14 = pshuflw(local_28,auVar6,0xff);
  local_18 = auVar14._0_4_;
  uStack_14 = local_18;
  uStack_10 = local_18;
  uStack_c = local_18;
  pauVar3 = (undefined1 (*) [16])(dst + 0x10);
  lVar5 = 0;
  do {
    auVar14 = *(undefined1 (*) [16])(local_48 + lVar5);
    pauVar3[-1] = auVar14;
    *pauVar3 = auVar14;
    lVar5 = lVar5 + 0x10;
    pauVar3 = (undefined1 (*) [16])(*pauVar3 + stride);
  } while (lVar5 != 0x40);
  auVar14 = pshufhw(auVar14,auVar6,0);
  local_48._8_4_ = auVar14._8_4_;
  local_48._4_4_ = local_48._8_4_;
  local_48._0_4_ = local_48._8_4_;
  local_48._12_4_ = local_48._8_4_;
  auVar14 = pshufhw(local_48,auVar6,0x55);
  local_38._8_4_ = auVar14._8_4_;
  local_38._4_4_ = local_38._8_4_;
  local_38._0_4_ = local_38._8_4_;
  local_38._12_4_ = local_38._8_4_;
  auVar14 = pshufhw(local_38,auVar6,0xaa);
  local_28._4_4_ = auVar14._8_4_;
  local_28._0_4_ = local_28._4_4_;
  local_28._8_4_ = local_28._4_4_;
  local_28._12_4_ = local_28._4_4_;
  auVar14 = pshufhw(auVar6,auVar6,0xff);
  local_18 = auVar14._8_4_;
  uStack_14 = local_18;
  uStack_10 = local_18;
  uStack_c = local_18;
  puVar4 = dst + stride * 4 + 0x10;
  lVar5 = 0;
  do {
    uVar1 = *(undefined8 *)(local_48 + lVar5);
    uVar2 = *(undefined8 *)(local_48 + lVar5 + 8);
    *(undefined8 *)(puVar4 + -0x10) = uVar1;
    *(undefined8 *)(puVar4 + -8) = uVar2;
    *(undefined8 *)puVar4 = uVar1;
    *(undefined8 *)(puVar4 + 8) = uVar2;
    lVar5 = lVar5 + 0x10;
    puVar4 = puVar4 + stride;
  } while (lVar5 != 0x40);
  return;
}

Assistant:

void aom_h_predictor_32x8_sse2(uint8_t *dst, ptrdiff_t stride,
                               const uint8_t *above, const uint8_t *left) {
  __m128i left_col, left_col_8p;
  (void)above;

  left_col = _mm_load_si128((const __m128i *)left);

  left_col_8p = _mm_unpacklo_epi8(left_col, left_col);
  h_prediction_32x8_1(&left_col_8p, dst, stride);
  dst += stride << 2;
  h_prediction_32x8_2(&left_col_8p, dst, stride);
}